

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawInstancedTests.cpp
# Opt level: O3

void __thiscall
vkt::Draw::anon_unknown_1::TestVertShader::shadeVertices
          (TestVertShader *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  VertexPacket *pVVar1;
  int instanceNdx;
  ulong uVar2;
  Vec4 color2;
  Vec4 color;
  Vec4 position;
  Vec4 local_68;
  Vec4 local_58;
  Vec4 local_48;
  
  if (0 < numPackets) {
    uVar2 = 0;
    do {
      instanceNdx = this->m_firstInstance + packets[uVar2]->instanceNdx;
      local_48.m_data[0] = 0.0;
      local_48.m_data[1] = 0.0;
      local_48.m_data[2] = 0.0;
      local_48.m_data[3] = 0.0;
      rr::readVertexAttrib(&local_48,inputs,instanceNdx,packets[uVar2]->vertexNdx);
      local_58.m_data[0] = 0.0;
      local_58.m_data[1] = 0.0;
      local_58.m_data[2] = 0.0;
      local_58.m_data[3] = 0.0;
      rr::readVertexAttrib(&local_58,inputs + 1,instanceNdx,packets[uVar2]->vertexNdx);
      local_68.m_data[0] = 0.0;
      local_68.m_data[1] = 0.0;
      local_68.m_data[2] = 0.0;
      local_68.m_data[3] = 0.0;
      rr::readVertexAttrib(&local_68,inputs + 2,instanceNdx,packets[uVar2]->vertexNdx);
      pVVar1 = packets[uVar2];
      (pVVar1->position).m_data[0] =
           ((float)pVVar1->instanceNdx + (float)pVVar1->instanceNdx) / (float)this->m_numInstances +
           local_48.m_data[0];
      (pVVar1->position).m_data[1] = local_48.m_data[1] + 0.0;
      (pVVar1->position).m_data[2] = local_48.m_data[2] + 0.0;
      (pVVar1->position).m_data[3] = local_48.m_data[3] + 0.0;
      pVVar1 = packets[uVar2];
      pVVar1->outputs[0].v.fData[0] =
           (float)instanceNdx / (float)this->m_numInstances + local_58.m_data[0] +
           local_68.m_data[0];
      pVVar1->outputs[0].v.fData[1] = local_58.m_data[1] + 0.0 + local_68.m_data[1];
      pVVar1->outputs[0].v.fData[2] = local_58.m_data[2] + 0.0 + local_68.m_data[2];
      pVVar1->outputs[0].v.fData[3] = local_58.m_data[3] + 1.0 + local_68.m_data[3];
      uVar2 = uVar2 + 1;
    } while ((uint)numPackets != uVar2);
  }
  return;
}

Assistant:

void shadeVertices (const rr::VertexAttrib* inputs,
						rr::VertexPacket* const* packets,
						const int numPackets) const
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		{
			const int		instanceNdx		= packets[packetNdx]->instanceNdx + m_firstInstance;
			const tcu::Vec4	position		= rr::readVertexAttribFloat(inputs[0], instanceNdx,	packets[packetNdx]->vertexNdx);
			const tcu::Vec4	color			= rr::readVertexAttribFloat(inputs[1], instanceNdx,	packets[packetNdx]->vertexNdx);
			const tcu::Vec4	color2			= rr::readVertexAttribFloat(inputs[2], instanceNdx, packets[packetNdx]->vertexNdx);
			packets[packetNdx]->position	= position + tcu::Vec4((float)(packets[packetNdx]->instanceNdx * 2.0 / m_numInstances), 0.0, 0.0, 0.0);
			packets[packetNdx]->outputs[0]	= color + tcu::Vec4((float)instanceNdx / (float)m_numInstances, 0.0, 0.0, 1.0) + color2;
		}
	}